

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

Vector<double,_2,_true> __thiscall
Nova::Vector<double,_2,_true>::operator-(Vector<double,_2,_true> *this,Vector<double,_2,_true> *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *in_RDX;
  Vector<double,_2,_true> VVar4;
  
  Vector(this,a);
  dVar1 = (this->_data)._M_elems[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[1];
  VVar4._data._M_elems[0] = (this->_data)._M_elems[0] - dVar2;
  (this->_data)._M_elems[0] = VVar4._data._M_elems[0];
  (this->_data)._M_elems[1] = dVar1 - dVar3;
  VVar4._data._M_elems[1] = dVar2;
  return (Vector<double,_2,_true>)VVar4._data._M_elems;
}

Assistant:

Vector operator-(const Vector& a) const
    {
        Vector data_copy(*this);
        data_copy-=a;
        return data_copy;
    }